

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool setFontFamilyFromValues(QList<QCss::Value> *values,QFont *font,int start)

{
  Data *pDVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  lVar3 = (long)start;
  if (lVar3 < (values->d).size) {
    lVar2 = lVar3 * 0x28 + 8;
    bVar4 = false;
    do {
      if (*(int *)((long)(values->d).ptr + lVar2 + -8) == 0xb) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_58);
        QList<QString>::end((QList<QString> *)&local_78);
        pDVar1 = local_58.d.d;
        if (local_58.d.ptr != (char16_t *)0x0) {
          local_58.d.d = (Data *)0x0;
          local_58.d.ptr = (char16_t *)0x0;
          local_58.d.size = 0;
          if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
            }
          }
        }
        bVar4 = false;
      }
      else {
        QVariant::toString();
        if (bVar4) {
          QString::append((QChar)(char16_t)&local_58);
        }
        QString::append((QString *)&local_58);
        bVar4 = true;
        LOCK();
        _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
        UNLOCK();
        if (_DAT_aaaaaaaaaaaaaaaa == 0) {
          QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,2,0x10);
        }
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x28;
    } while (lVar3 < (values->d).size);
    if (local_58.d.size != 0) {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_58);
      QList<QString>::end((QList<QString> *)&local_78);
    }
    if (local_78.size != 0) {
      QFont::setFamilies(font,(QStringList *)&local_78);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
  }
  __stack_chk_fail();
}

Assistant:

static bool setFontFamilyFromValues(const QList<QCss::Value> &values, QFont *font, int start = 0)
{
    QString family;
    QStringList families;
    bool shouldAddSpace = false;
    for (int i = start; i < values.size(); ++i) {
        const QCss::Value &v = values.at(i);
        if (v.type == Value::TermOperatorComma) {
            families << family;
            family.clear();
            shouldAddSpace = false;
            continue;
        }
        const QString str = v.variant.toString();
        if (str.isEmpty())
            break;
        if (shouldAddSpace)
            family += u' ';
        family += str;
        shouldAddSpace = true;
    }
    if (!family.isEmpty())
        families << family;
    if (families.isEmpty())
        return false;
    font->setFamilies(families);
    return true;
}